

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void clearbykeys(global_State *g,GCObject *l)

{
  byte bVar1;
  Node *pNVar2;
  int iVar3;
  GCObject *local_40;
  Node *local_30;
  Node *n;
  Node *limit;
  Table *h;
  GCObject *l_local;
  global_State *g_local;
  
  for (h = (Table *)l; h != (Table *)0x0; h = (Table *)h->gclist) {
    pNVar2 = h->node;
    bVar1 = h->lsizenode;
    for (local_30 = h->node; local_30 < pNVar2 + (1 << (bVar1 & 0x1f)); local_30 = local_30 + 1) {
      if (((local_30->u).key_tt & 0x40) == 0) {
        local_40 = (GCObject *)0x0;
      }
      else {
        local_40 = (local_30->u).key_val.gc;
      }
      iVar3 = iscleared(g,local_40);
      if (iVar3 != 0) {
        (local_30->u).tt_ = '\x10';
      }
      if (((local_30->u).tt_ & 0xf) == 0) {
        clearkey(local_30);
      }
    }
  }
  return;
}

Assistant:

static void clearbykeys (global_State *g, GCObject *l) {
  for (; l; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *limit = gnodelast(h);
    Node *n;
    for (n = gnode(h, 0); n < limit; n++) {
      if (iscleared(g, gckeyN(n)))  /* unmarked key? */
        setempty(gval(n));  /* remove entry */
      if (isempty(gval(n)))  /* is entry empty? */
        clearkey(n);  /* clear its key */
    }
  }
}